

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O0

Vector * SSORIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType Dummy,double Omega)

{
  LASErrIdType LVar1;
  Boolean BVar2;
  Vector *pVVar3;
  QMatrix *pQVar4;
  QMatrix *pQVar5;
  QMatrix *pQVar6;
  QMatrix *Q2;
  double bNorm_00;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 local_80 [8];
  Vector r;
  size_t Dim;
  double bNorm;
  int Iter;
  double Omega_local;
  PrecondProcType Dummy_local;
  int MaxIter_local;
  Vector *b_local;
  Vector *x_local;
  QMatrix *A_local;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  r.Cmp = (Real *)Q_GetDim(A);
  V_Constr((Vector *)local_80,"r",(size_t)r.Cmp,Normal,True);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    bNorm_00 = l2Norm_V(b);
    bNorm._4_4_ = 0;
    dVar7 = l1Norm_V(x);
    auVar8._8_4_ = (int)((ulong)r.Cmp >> 0x20);
    auVar8._0_8_ = r.Cmp;
    auVar8._12_4_ = 0x45300000;
    if (ABS(dVar7 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)r.Cmp) - 4503599627370496.0))) <
        2.2250738585072014e-307) {
      Asgn_VV((Vector *)local_80,b);
    }
    else {
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar3 = Mul_QV(A,x);
      pVVar3 = Sub_VV(b,pVVar3);
      Asgn_VV((Vector *)local_80,pVVar3);
    }
    while( true ) {
      dVar7 = l2Norm_V((Vector *)local_80);
      BVar2 = RTCResult(bNorm._4_4_,dVar7,bNorm_00,SSORIterId);
      if (BVar2 != False || MaxIter <= bNorm._4_4_) break;
      bNorm._4_4_ = bNorm._4_4_ + 1;
      pQVar4 = Diag_Q(A);
      pQVar4 = Mul_SQ(1.0 / Omega,pQVar4);
      pQVar5 = Upper_Q(A);
      pQVar4 = Add_QQ(pQVar4,pQVar5);
      pQVar5 = Diag_Q(A);
      pQVar6 = Diag_Q(A);
      pQVar6 = Mul_SQ(1.0 / Omega,pQVar6);
      Q2 = Lower_Q(A);
      pQVar6 = Add_QQ(pQVar6,Q2);
      pVVar3 = MulInv_QV(pQVar6,(Vector *)local_80);
      pVVar3 = Mul_QV(pQVar5,pVVar3);
      pVVar3 = MulInv_QV(pQVar4,pVVar3);
      pVVar3 = Mul_SV((2.0 - Omega) / Omega,pVVar3);
      AddAsgn_VV(x,pVVar3);
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(x,A);
      }
      if (bNorm._4_4_ < MaxIter) {
        pVVar3 = Mul_QV(A,x);
        pVVar3 = Sub_VV(b,pVVar3);
        Asgn_VV((Vector *)local_80,pVVar3);
      }
    }
  }
  V_Destr((Vector *)local_80);
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *SSORIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType Dummy, double Omega)
{
    (void) Dummy;
    
    int Iter;
    double bNorm;
    size_t Dim;
    Vector r;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        while (!RTCResult(Iter, l2Norm_V(&r), bNorm, SSORIterId)
            && Iter < MaxIter) {
            Iter++;
            /* x(i+1) = x(i) + (2 - Omega) * (Diag(A) / Omega + Upper(A))^(-1)
                   * Diag(A) / Omega * (Diag(A) / Omega + Lower(A))^(-1) r */
            AddAsgn_VV(x, Mul_SV((2.0 - Omega) / Omega,
                MulInv_QV(Add_QQ(Mul_SQ(1.0 / Omega, Diag_Q(A)), Upper_Q(A)),
                Mul_QV(Diag_Q(A),
                MulInv_QV(Add_QQ(Mul_SQ(1.0 / Omega, Diag_Q(A)), Lower_Q(A)), &r)))));
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            /* r = b - A * x(i) */
            if (Iter < MaxIter)
                Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        }
    }

    V_Destr(&r);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}